

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

AssertionResult * __thiscall
Catch::ResultBuilder::build(AssertionResult *__return_storage_ptr__,ResultBuilder *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_80 [32];
  undefined1 local_60 [8];
  AssertionResultData data;
  ResultBuilder *this_local;
  
  data._64_8_ = this;
  if ((this->m_data).resultType == Unknown) {
    __assert_fail("m_data.resultType != ResultWas::Unknown",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Ruzzz[P]htmlcxx/tests/../3rd/catch/catch.hpp"
                  ,0x20ad,"AssertionResult Catch::ResultBuilder::build() const");
  }
  AssertionResultData::AssertionResultData((AssertionResultData *)local_60,&this->m_data);
  if (((this->m_exprComponents).testFalse & 1U) != 0) {
    if (data.message.field_2._8_4_ == 0) {
      data.message.field_2._8_4_ = 0x11;
    }
    else if (data.message.field_2._8_4_ == 0x11) {
      data.message.field_2._8_4_ = 0;
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)(data.reconstructedExpression.field_2._M_local_buf + 8),local_80);
  std::__cxx11::string::~string(local_80);
  reconstructExpression_abi_cxx11_(&local_b0,this);
  std::__cxx11::string::operator=((string *)local_60,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  if (((this->m_exprComponents).testFalse & 1U) != 0) {
    bVar1 = std::operator==(&(this->m_exprComponents).op,"");
    if (bVar1) {
      std::operator+(&local_d0,"!",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::__cxx11::string::operator=((string *)local_60,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    else {
      std::operator+(&local_110,"!(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::operator+(&local_f0,&local_110,")");
      std::__cxx11::string::operator=((string *)local_60,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
    }
  }
  AssertionResult::AssertionResult
            (__return_storage_ptr__,&this->m_assertionInfo,(AssertionResultData *)local_60);
  AssertionResultData::~AssertionResultData((AssertionResultData *)local_60);
  return __return_storage_ptr__;
}

Assistant:

AssertionResult ResultBuilder::build() const
    {
        assert( m_data.resultType != ResultWas::Unknown );

        AssertionResultData data = m_data;

        // Flip bool results if testFalse is set
        if( m_exprComponents.testFalse ) {
            if( data.resultType == ResultWas::Ok )
                data.resultType = ResultWas::ExpressionFailed;
            else if( data.resultType == ResultWas::ExpressionFailed )
                data.resultType = ResultWas::Ok;
        }

        data.message = m_stream.oss.str();
        data.reconstructedExpression = reconstructExpression();
        if( m_exprComponents.testFalse ) {
            if( m_exprComponents.op == "" )
                data.reconstructedExpression = "!" + data.reconstructedExpression;
            else
                data.reconstructedExpression = "!(" + data.reconstructedExpression + ")";
        }
        return AssertionResult( m_assertionInfo, data );
    }